

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O2

Pass * wasm::createPrecomputePropagatePass(void)

{
  Precompute *this;
  
  this = (Precompute *)operator_new(0x180);
  Precompute::Precompute(this,true);
  return (Pass *)this;
}

Assistant:

Pass* createPrecomputePropagatePass() { return new Precompute(true); }